

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServer::RegisterProtocol(cmServer *this,cmServerProtocol *protocol)

{
  uint __line;
  bool bVar1;
  int iVar2;
  int extraout_var;
  long lVar3;
  char *__assertion;
  __normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
  _Var4;
  long lVar5;
  __normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
  __it;
  undefined8 local_50;
  cmServerProtocol **local_48;
  vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *local_40;
  cmServerProtocol *protocol_local;
  
  protocol_local = protocol;
  iVar2 = (*protocol->_vptr_cmServerProtocol[3])(protocol);
  if (((char)iVar2 != '\0') && (this->SupportExperimental == false)) {
    (*protocol->_vptr_cmServerProtocol[1])(protocol);
    return;
  }
  iVar2 = (*protocol->_vptr_cmServerProtocol[2])(protocol);
  local_50 = CONCAT44(extraout_var,iVar2);
  if (iVar2 < 0) {
    __assertion = "version.first >= 0";
    __line = 0x7c;
LAB_0030153f:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                  ,__line,"void cmServer::RegisterProtocol(cmServerProtocol *)");
  }
  if (extraout_var < 0) {
    __assertion = "version.second >= 0";
    __line = 0x7d;
    goto LAB_0030153f;
  }
  local_40 = &this->SupportedProtocols;
  __it._M_current =
       (this->SupportedProtocols).
       super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48 = (this->SupportedProtocols).
             super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar5 = (long)local_48 - (long)__it._M_current;
  for (lVar3 = lVar5 >> 5; _Var4._M_current = __it._M_current, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::$_0>::
            operator()((_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::__0> *)&local_50,
                       __it);
    if (bVar1) goto LAB_003014e8;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::$_0>::
            operator()((_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::__0> *)&local_50,
                       (__normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
                        )(__it._M_current + 1));
    _Var4._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_003014e8;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::$_0>::
            operator()((_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::__0> *)&local_50,
                       (__normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
                        )(__it._M_current + 2));
    _Var4._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_003014e8;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::$_0>::
            operator()((_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::__0> *)&local_50,
                       (__normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
                        )(__it._M_current + 3));
    _Var4._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_003014e8;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = local_48;
      if ((lVar5 != 3) ||
         (bVar1 = __gnu_cxx::__ops::_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::$_0>::
                  operator()((_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::__0> *)
                             &local_50,__it), _Var4._M_current = __it._M_current, bVar1))
      goto LAB_003014e8;
      _Var4._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::$_0>::
            operator()((_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::__0> *)&local_50,
                       _Var4);
    if (bVar1) goto LAB_003014e8;
    __it._M_current = _Var4._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::$_0>::
          operator()((_Iter_pred<cmServer::RegisterProtocol(cmServerProtocol*)::__0> *)&local_50,
                     __it);
  _Var4._M_current = local_48;
  if (bVar1) {
    _Var4._M_current = __it._M_current;
  }
LAB_003014e8:
  if (_Var4._M_current ==
      (this->SupportedProtocols).
      super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::push_back
              (local_40,&protocol_local);
  }
  return;
}

Assistant:

void cmServer::RegisterProtocol(cmServerProtocol* protocol)
{
  if (protocol->IsExperimental() && !this->SupportExperimental) {
    delete protocol;
    return;
  }
  auto version = protocol->ProtocolVersion();
  assert(version.first >= 0);
  assert(version.second >= 0);
  auto it = std::find_if(this->SupportedProtocols.begin(),
                         this->SupportedProtocols.end(),
                         [version](cmServerProtocol* p) {
                           return p->ProtocolVersion() == version;
                         });
  if (it == this->SupportedProtocols.end()) {
    this->SupportedProtocols.push_back(protocol);
  }
}